

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O2

void gba_system_loop(void)

{
  arm7tdmi_t *paVar1;
  gba_apu_t *pgVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  gba_ppu_t *in_RDI;
  int iVar7;
  int line;
  int iVar8;
  bool bVar9;
  
  iVar6 = 0;
  while (should_quit == false) {
    for (iVar8 = 0; iVar5 = 1, iVar8 != 0xa0; iVar8 = iVar8 + 1) {
      for (iVar6 = iVar6 + 0x3c0; paVar1 = cpu, 0 < iVar6; iVar6 = iVar6 - iVar3) {
        cpu_stepped = false;
        bVar9 = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
        cpu->irq = bVar9;
        iVar3 = iVar5;
        if ((~paVar1->halt & 1U) != 0 || bVar9) {
          cpu_stepped = true;
          iVar3 = arm7tdmi_step(paVar1);
        }
        timer_tick(iVar3);
        iVar7 = 0;
        if (0 < iVar3) {
          iVar7 = iVar3;
        }
        while (pgVar2 = apu, bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
          uVar4 = apu->apu_cycle_counter + 1;
          apu->apu_cycle_counter = uVar4;
          if (0x15d < uVar4) {
            pgVar2->apu_cycle_counter = 0;
            apu_push_sample(pgVar2);
          }
        }
      }
      ppu_hblank(ppu);
      for (iVar6 = iVar6 + 0x110; paVar1 = cpu, 0 < iVar6; iVar6 = iVar6 - iVar3) {
        cpu_stepped = false;
        bVar9 = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
        cpu->irq = bVar9;
        iVar3 = iVar5;
        if ((~paVar1->halt & 1U) != 0 || bVar9) {
          cpu_stepped = true;
          iVar3 = arm7tdmi_step(paVar1);
        }
        timer_tick(iVar3);
        iVar7 = 0;
        if (0 < iVar3) {
          iVar7 = iVar3;
        }
        while (pgVar2 = apu, bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
          uVar4 = apu->apu_cycle_counter + 1;
          apu->apu_cycle_counter = uVar4;
          if (0x15d < uVar4) {
            pgVar2->apu_cycle_counter = 0;
            apu_push_sample(pgVar2);
          }
        }
      }
      ppu_end_hblank(ppu);
    }
    ppu_vblank(ppu);
    for (iVar8 = 0; iVar8 != 0x44; iVar8 = iVar8 + 1) {
      for (iVar6 = iVar6 + 0x3c0; paVar1 = cpu, 0 < iVar6; iVar6 = iVar6 - iVar3) {
        cpu_stepped = false;
        bVar9 = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
        cpu->irq = bVar9;
        iVar3 = iVar5;
        if ((~paVar1->halt & 1U) != 0 || bVar9) {
          cpu_stepped = true;
          iVar3 = arm7tdmi_step(paVar1);
        }
        timer_tick(iVar3);
        iVar7 = 0;
        if (0 < iVar3) {
          iVar7 = iVar3;
        }
        while (pgVar2 = apu, bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
          uVar4 = apu->apu_cycle_counter + 1;
          apu->apu_cycle_counter = uVar4;
          if (0x15d < uVar4) {
            pgVar2->apu_cycle_counter = 0;
            apu_push_sample(pgVar2);
          }
        }
      }
      ppu_hblank(ppu);
      for (iVar6 = iVar6 + 0x110; paVar1 = cpu, 0 < iVar6; iVar6 = iVar6 - iVar3) {
        cpu_stepped = false;
        bVar9 = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
        cpu->irq = bVar9;
        iVar3 = iVar5;
        if ((~paVar1->halt & 1U) != 0 || bVar9) {
          cpu_stepped = true;
          iVar3 = arm7tdmi_step(paVar1);
        }
        timer_tick(iVar3);
        iVar7 = 0;
        if (0 < iVar3) {
          iVar7 = iVar3;
        }
        while (pgVar2 = apu, bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
          uVar4 = apu->apu_cycle_counter + 1;
          apu->apu_cycle_counter = uVar4;
          if (0x15d < uVar4) {
            pgVar2->apu_cycle_counter = 0;
            apu_push_sample(pgVar2);
          }
        }
      }
      ppu_end_hblank(ppu);
    }
    in_RDI = ppu;
    ppu_end_vblank(ppu);
    persist_backup();
  }
  cleanup((EVP_PKEY_CTX *)in_RDI);
  return;
}

Assistant:

void gba_system_loop() {
    int extra = 0;
    while (!should_quit) {
        for (int line = 0; line < VISIBLE_LINES; line++) {
            extra = run_system(VISIBLE_CYCLES + extra);
            ppu_hblank(ppu);
            extra = run_system(HBLANK_CYCLES + extra);
            ppu_end_hblank(ppu);
        }
        ppu_vblank(ppu);
        for (int line = 0; line < VBLANK_LINES; line++) {
            extra = run_system(VISIBLE_CYCLES + extra);
            ppu_hblank(ppu);
            extra = run_system(HBLANK_CYCLES + extra);
            ppu_end_hblank(ppu);
        }
        ppu_end_vblank(ppu);
        persist_backup();
    }

    cleanup();
}